

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O3

void __thiscall
cmGraphVizWriter::WriteNode(cmGraphVizWriter *this,cmGeneratedFileStream *fs,cmLinkItem *item)

{
  TargetType TVar1;
  string *__k;
  mapped_type *pmVar2;
  ostream *poVar3;
  size_t sVar4;
  char *__s;
  char in_R8B;
  string escapedLabel;
  string itemNameWithAliases;
  string local_70;
  string local_50;
  
  __k = cmLinkItem::AsStr_abi_cxx11_(item);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->NodeNames,__k);
  ItemNameWithAliases(&local_50,this,__k);
  cmsys::SystemTools::EscapeChars_abi_cxx11_
            (&local_70,(SystemTools *)local_50._M_dataplus._M_p,"\"",(char *)0x5c,in_R8B);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fs,"    \"",5);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)fs,(pmVar2->_M_dataplus)._M_p,pmVar2->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" [ label = \"",0xd);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\", shape = ",0xb);
  __s = "septagon";
  if (item->Target != (cmGeneratorTarget *)0x0) {
    TVar1 = cmGeneratorTarget::GetType(item->Target);
    if (TVar1 < UNKNOWN_LIBRARY) {
      __s = &DAT_007145f4 + *(int *)(&DAT_007145f4 + (ulong)TVar1 * 4);
    }
  }
  sVar4 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,__s,sVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ];\n",4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGraphVizWriter::WriteNode(cmGeneratedFileStream& fs,
                                 cmLinkItem const& item)
{
  auto const& itemName = item.AsStr();
  auto const& nodeName = this->NodeNames[itemName];

  auto const itemNameWithAliases = this->ItemNameWithAliases(itemName);
  auto const escapedLabel = EscapeForDotFile(itemNameWithAliases);

  fs << "    \"" << nodeName << "\" [ label = \"" << escapedLabel
     << "\", shape = " << getShapeForTarget(item) << " ];\n";
}